

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile(TiledRgbaInputFile *this)

{
  undefined8 *in_RDI;
  TiledInputFile *in_stack_ffffffffffffffe0;
  void *pvVar1;
  
  *in_RDI = &PTR__TiledRgbaInputFile_002ad4f0;
  pvVar1 = (void *)in_RDI[1];
  if (pvVar1 != (void *)0x0) {
    TiledInputFile::~TiledInputFile(in_stack_ffffffffffffffe0);
    operator_delete(pvVar1,0x20);
  }
  pvVar1 = (void *)in_RDI[2];
  if (pvVar1 != (void *)0x0) {
    FromYa::~FromYa((FromYa *)0x24d8a7);
    operator_delete(pvVar1,0x78);
  }
  std::__cxx11::string::~string((string *)(in_RDI + 3));
  return;
}

Assistant:

TiledRgbaInputFile::~TiledRgbaInputFile ()
{
    delete _inputFile;
    delete _fromYa;
}